

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

void C_DoCommand(char *cmd,int keynum)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  DWORD DVar4;
  FButtonStatus *this;
  FConsoleCommand *command;
  FBaseCVar *this_00;
  char *pcVar5;
  DStoredCommand *this_01;
  undefined4 extraout_var;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  ulong __n;
  bool bVar9;
  bool bVar10;
  FConsoleCommand *dummy;
  FCommandLine local_58;
  
  do {
    pcVar5 = cmd;
    cVar1 = *pcVar5;
    cmd = pcVar5 + 1;
    if (cVar1 == '\0') break;
  } while (cVar1 < '!');
  pcVar7 = cmd;
  pcVar8 = pcVar5;
  if (cVar1 == '\"') {
    for (; (pcVar5 = cmd, *pcVar7 != '\0' && (*pcVar7 != '\"')); pcVar7 = pcVar7 + 1) {
    }
  }
  else {
    do {
      pcVar2 = pcVar8 + 1;
      pcVar7 = pcVar8 + 1;
      pcVar8 = pcVar7;
    } while (' ' < *pcVar2);
  }
  __n = (long)pcVar7 - (long)pcVar5;
  if (ParsingKeyConf) {
    bVar10 = true;
    lVar6 = 8;
    while( true ) {
      pcVar7 = KeyConfCommands[lVar6];
      iVar3 = strncasecmp(pcVar5,pcVar7,__n);
      if ((iVar3 == 0) && (pcVar7[__n] == '\0')) break;
      bVar10 = lVar6 != 0;
      bVar9 = lVar6 == 0;
      lVar6 = lVar6 + -1;
      if (bVar9) {
LAB_0047c216:
        Printf("Invalid command for KEYCONF: %s\n",pcVar5);
        return;
      }
    }
    if (bVar10) goto LAB_0047c23b;
    goto LAB_0047c216;
  }
LAB_0047c23b:
  cVar1 = *pcVar5;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    DVar4 = SuperFastHashI(pcVar5 + 1,__n - 1);
    this = FindButton(DVar4);
    if (this != (FButtonStatus *)0x0) {
      if (cVar1 == '+') {
        FButtonStatus::PressKey(this,keynum);
        return;
      }
      FButtonStatus::ReleaseKey(this,keynum);
      if (this != &Button_Mlook) {
        return;
      }
      if (lookspring.Value != true) {
        return;
      }
      Net_WriteByte('$');
      return;
    }
  }
  DVar4 = SuperFastHashI(pcVar5,__n);
  command = ScanChainForName(Commands[DVar4 % 0xfb],pcVar5,__n,(FConsoleCommand **)&local_58);
  local_58.cmd = pcVar5;
  if (command == (FConsoleCommand *)0x0) {
    this_00 = FindCVarSub(pcVar5,(int)__n);
    if (this_00 == (FBaseCVar *)0x0) {
      Printf("Unknown command \"%.*s\"\n",__n & 0xffffffff,pcVar5);
      return;
    }
    local_58._argc = -1;
    local_58._argv = (char **)0x0;
    local_58.noescapes = false;
    iVar3 = FCommandLine::argc(&local_58);
    if (iVar3 < 2) {
      pcVar5 = this_00->Name;
      iVar3 = (*this_00->_vptr_FBaseCVar[3])(this_00,0xffffffff);
      Printf("\"%s\" is \"%s\"\n",pcVar5,CONCAT44(extraout_var,iVar3));
    }
    else {
      pcVar5 = FCommandLine::operator[](&local_58,1);
      FBaseCVar::CmdSet(this_00,pcVar5);
    }
    goto LAB_0047c32a;
  }
  if ((gamestate == GS_STARTUP) && (ParsingKeyConf == false)) {
    if (__n == 9) {
      iVar3 = strncasecmp(pcVar5,"unbindall",9);
joined_r0x0047c451:
      if (iVar3 == 0) goto LAB_0047c2e6;
    }
    else {
      if (__n == 7) {
        iVar3 = strncasecmp(pcVar5,"logfile",7);
        goto joined_r0x0047c451;
      }
      if (__n == 3) {
        iVar3 = strncasecmp(pcVar5,"set",3);
        goto joined_r0x0047c451;
      }
    }
    if ((__n != 4) ||
       ((iVar3 = strncasecmp(pcVar5,"bind",4), iVar3 != 0 &&
        (iVar3 = strncasecmp(pcVar5,"exec",4), iVar3 != 0)))) {
      if (__n == 6) {
        iVar3 = strncasecmp(pcVar5,"pullin",6);
      }
      else {
        if (__n != 10) goto LAB_0047c4df;
        iVar3 = strncasecmp(pcVar5,"doublebind",10);
      }
      if (iVar3 != 0) {
LAB_0047c4df:
        if ((__n == 4) && (iVar3 = strncasecmp(pcVar5,"warp",4), iVar3 == 0)) {
          FString::operator=(&StoredWarp,pcVar5);
          return;
        }
        this_01 = (DStoredCommand *)
                  M_Malloc_Dbg(0x48,
                               "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                               ,0x1f7);
        DStoredCommand::DStoredCommand(this_01,command,pcVar5);
        return;
      }
    }
  }
LAB_0047c2e6:
  local_58._argc = -1;
  local_58._argv = (char **)0x0;
  local_58.noescapes = false;
  (*command->_vptr_FConsoleCommand[3])
            (command,&local_58,(&players)[(long)consoleplayer * 0x54],(ulong)(uint)keynum);
LAB_0047c32a:
  if (local_58._argv != (char **)0x0) {
    operator_delete__(local_58._argv);
  }
  return;
}

Assistant:

void C_DoCommand (const char *cmd, int keynum)
{
	FConsoleCommand *com;
	const char *end;
	const char *beg;

	// Skip any beginning whitespace
	while (*cmd && *cmd <= ' ')
		cmd++;

	// Find end of the command name
	if (*cmd == '\"')
	{
		for (end = beg = cmd+1; *end && *end != '\"'; ++end)
			;
	}
	else
	{
		beg = cmd;
		for (end = cmd+1; *end > ' '; ++end)
			;
	}

	const size_t len = end - beg;

	if (ParsingKeyConf)
	{
		int i;

		for (i = countof(KeyConfCommands)-1; i >= 0; --i)
		{
			if (strnicmp (beg, KeyConfCommands[i], len) == 0 &&
				KeyConfCommands[i][len] == 0)
			{
				break;
			}
		}
		if (i < 0)
		{
			Printf ("Invalid command for KEYCONF: %s\n", beg);
			return;
		}
	}

	// Check if this is an action
	if (*beg == '+' || *beg == '-')
	{
		FButtonStatus *button;

		button = FindButton (MakeKey (beg + 1, end - beg - 1));
		if (button != NULL)
		{
			if (*beg == '+')
			{
				button->PressKey (keynum);
			}
			else
			{
				button->ReleaseKey (keynum);
				if (button == &Button_Mlook && lookspring)
				{
					Net_WriteByte (DEM_CENTERVIEW);
				}
			}
			return;
		}
	}
	
	// Parse it as a normal command
	// Checking for matching commands follows this search order:
	//	1. Check the Commands[] hash table
	//	2. Check the CVars list

	if ( (com = FindNameInHashTable (Commands, beg, len)) )
	{
		if (gamestate != GS_STARTUP || ParsingKeyConf ||
			(len == 3 && strnicmp (beg, "set", 3) == 0) ||
			(len == 7 && strnicmp (beg, "logfile", 7) == 0) ||
			(len == 9 && strnicmp (beg, "unbindall", 9) == 0) ||
			(len == 4 && strnicmp (beg, "bind", 4) == 0) ||
			(len == 4 && strnicmp (beg, "exec", 4) == 0) ||
			(len ==10 && strnicmp (beg, "doublebind", 10) == 0) ||
			(len == 6 && strnicmp (beg, "pullin", 6) == 0)
			)
		{
			FCommandLine args (beg);
			com->Run (args, players[consoleplayer].mo, keynum);
		}
		else
		{
			if (len == 4 && strnicmp(beg, "warp", 4) == 0)
			{
				StoredWarp = beg;
			}
			else
			{
				new DStoredCommand (com, beg);
			}
		}
	}
	else
	{ // Check for any console vars that match the command
		FBaseCVar *var = FindCVarSub (beg, int(len));

		if (var != NULL)
		{
			FCommandLine args (beg);

			if (args.argc() >= 2)
			{ // Set the variable
				var->CmdSet (args[1]);
			}
			else
			{ // Get the variable's value
				Printf ("\"%s\" is \"%s\"\n", var->GetName(), var->GetHumanString());
			}
		}
		else
		{ // We don't know how to handle this command
			Printf ("Unknown command \"%.*s\"\n", (int)len, beg);
		}
	}
}